

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arguments.cpp
# Opt level: O1

string * __thiscall
arguments_t::operator[][abi_cxx11_(string *__return_storage_ptr__,arguments_t *this,int index)

{
  pointer pbVar1;
  pointer pcVar2;
  
  pbVar1 = (this->parameters).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = pbVar1[index]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + pbVar1[index]._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string arguments_t::operator[](int index) const {
    return this->parameters[index];
}